

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O2

int __thiscall ncnn::LRN::load_param(LRN *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->region_type = iVar1;
  iVar1 = ParamDict::get(pd,1,5);
  this->local_size = iVar1;
  fVar2 = ParamDict::get(pd,2,1.0);
  this->alpha = fVar2;
  fVar2 = ParamDict::get(pd,3,0.75);
  this->beta = fVar2;
  fVar2 = ParamDict::get(pd,4,1.0);
  this->bias = fVar2;
  return 0;
}

Assistant:

int LRN::load_param(const ParamDict& pd)
{
    region_type = pd.get(0, 0);
    local_size = pd.get(1, 5);
    alpha = pd.get(2, 1.f);
    beta = pd.get(3, 0.75f);
    bias = pd.get(4, 1.f);

    return 0;
}